

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromAPInt
          (IEEEFloat *this,APInt *Val,bool isSigned,roundingMode rounding_mode)

{
  uint uVar1;
  bool bVar2;
  opStatus oVar3;
  undefined7 in_register_00000011;
  anon_union_8_2_1313ab2f_for_U src;
  APInt api;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  APInt local_50;
  APInt local_40;
  
  uVar1 = Val->BitWidth;
  APInt::APInt((APInt *)&local_60,Val);
  this->field_0x12 = this->field_0x12 & 0xf7;
  if ((int)CONCAT71(in_register_00000011,isSigned) != 0) {
    bVar2 = APInt::isNegative((APInt *)&local_60);
    if (bVar2) {
      this->field_0x12 = this->field_0x12 | 8;
      APInt::APInt(&local_50,(APInt *)&local_60);
      operator-((llvm *)&local_40,&local_50);
      APInt::operator=((APInt *)&local_60,&local_40);
      APInt::~APInt(&local_40);
      APInt::~APInt(&local_50);
    }
  }
  src.pVal = (uint64_t *)&local_60;
  if (0x40 < local_58) {
    src = local_60;
  }
  oVar3 = convertFromUnsignedParts(this,src.pVal,(uint)((ulong)uVar1 + 0x3f >> 6),rounding_mode);
  APInt::~APInt((APInt *)&local_60);
  return oVar3;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convertFromAPInt(const APInt &Val, bool isSigned,
                                                roundingMode rounding_mode) {
  unsigned int partCount = Val.getNumWords();
  APInt api = Val;

  sign = false;
  if (isSigned && api.isNegative()) {
    sign = true;
    api = -api;
  }

  return convertFromUnsignedParts(api.getRawData(), partCount, rounding_mode);
}